

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

Vector2<unsigned_long> __thiscall
gui::MultilineTextBox::findCaretPosition(MultilineTextBox *this,size_t caretOffset)

{
  size_t sVar1;
  ulong in_RSI;
  long in_RDI;
  size_t caretRemaining;
  size_t y;
  ulong local_30;
  size_type local_28;
  Vector2<unsigned_long> local_10;
  
  local_28 = 0;
  local_30 = in_RSI;
  while( true ) {
    std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
              ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_28);
    sVar1 = sf::String::getSize((String *)0x1a5b83);
    if (local_30 <= sVar1) break;
    std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
              ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_28);
    sVar1 = sf::String::getSize((String *)0x1a5bae);
    local_30 = local_30 - (sVar1 + 1);
    local_28 = local_28 + 1;
  }
  sf::Vector2<unsigned_long>::Vector2(&local_10,local_30,local_28);
  return local_10;
}

Assistant:

sf::Vector2<size_t> MultilineTextBox::findCaretPosition(size_t caretOffset) const {
    size_t y = 0;
    size_t caretRemaining = caretOffset;
    while (caretRemaining > boxStrings_[y].getSize()) {
        caretRemaining -= boxStrings_[y].getSize() + 1;
        ++y;
    }
    return {caretRemaining, y};
}